

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  Type TVar2;
  int iVar3;
  uint uVar4;
  LogMessage *pLVar5;
  _Base_ptr p_Var6;
  _Base_ptr *pp_Var7;
  undefined4 extraout_var;
  undefined8 uVar8;
  undefined4 extraout_var_01;
  string *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 *puVar10;
  _Base_ptr p_Var11;
  _func_int **pp_Var12;
  _Base_ptr p_Var13;
  string scratch;
  string truncated_value;
  undefined1 local_c8 [16];
  _Rb_tree_node_base local_b8;
  undefined1 local_90 [32];
  _Base_ptr local_70 [2];
  undefined1 local_60 [16];
  _Base_ptr local_50;
  _Base_ptr local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  Message *message_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  if ((index != -1) && (*(int *)(field + 0x4c) != 3)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x6d0);
    pLVar5 = internal::LogMessage::operator<<
                       ((LogMessage *)local_c8,
                        "CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)local_90,pLVar5);
    internal::LogMessage::~LogMessage((LogMessage *)local_c8);
  }
  p_Var13 = (_Base_ptr)(this->default_field_value_printer_).ptr_;
  local_c8._0_8_ = p_Var13;
  p_Var11 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var11 != (_Base_ptr)0x0) {
    p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var11 + 1) >= field) {
        p_Var6 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[*(FieldDescriptor **)(p_Var11 + 1) < field];
    } while (p_Var11 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      pp_Var7 = (_Base_ptr *)local_c8;
      if (*(FieldDescriptor **)(p_Var6 + 1) <= field) {
        pp_Var7 = &p_Var6[1]._M_parent;
      }
      p_Var13 = *pp_Var7;
    }
  }
  TVar2 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4)) {
  case 1:
    if (*(int *)(field + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x2a])();
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
    }
    (*(*(_func_int ***)p_Var13)[3])(local_c8,p_Var13,(ulong)uVar4);
    TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    break;
  case 2:
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x2b])();
      uVar8 = CONCAT44(extraout_var_01,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
      uVar8 = CONCAT44(extraout_var_05,iVar3);
    }
    (*(*(_func_int ***)p_Var13)[5])(local_c8,p_Var13,uVar8);
    TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    break;
  case 3:
    if (*(int *)(field + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x2c])();
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x13])(reflection,message,field);
    }
    (*(*(_func_int ***)p_Var13)[4])(local_c8,p_Var13,(ulong)uVar4);
    TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    break;
  case 4:
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x2d])();
      uVar8 = CONCAT44(extraout_var_00,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x14])(reflection,message,field);
      uVar8 = CONCAT44(extraout_var_04,iVar3);
    }
    (*(*(_func_int ***)p_Var13)[6])(local_c8,p_Var13,uVar8);
    TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    break;
  case 5:
    if (*(int *)(field + 0x4c) == 3) {
      (*reflection->_vptr_Reflection[0x2f])();
    }
    else {
      (*reflection->_vptr_Reflection[0x16])(reflection,message,field);
    }
    (*(*(_func_int ***)p_Var13)[8])(local_c8,p_Var13);
    TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    break;
  case 6:
    if (*(int *)(field + 0x4c) == 3) {
      (*reflection->_vptr_Reflection[0x2e])();
    }
    else {
      (*reflection->_vptr_Reflection[0x15])(reflection,message,field);
    }
    (*(*(_func_int ***)p_Var13)[7])(local_c8,p_Var13);
    TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    break;
  case 7:
    if (*(int *)(field + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x30])();
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x17])(reflection,message,field);
    }
    (*(*(_func_int ***)p_Var13)[2])(local_c8,p_Var13,(ulong)(uVar4 & 0xff));
    TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    break;
  case 8:
    if (*(int *)(field + 0x4c) == 3) {
      uVar4 = (*reflection->_vptr_Reflection[0x33])();
    }
    else {
      uVar4 = (*reflection->_vptr_Reflection[0x1a])(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar9 = EnumDescriptor::FindValueByNumber(this_01,uVar4);
    if (pEVar9 == (EnumValueDescriptor *)0x0) {
      StringPrintf_abi_cxx11_((string *)local_90,"%d",(ulong)uVar4);
      (*(*(_func_int ***)p_Var13)[0xb])(local_c8,p_Var13,(ulong)uVar4,(string *)local_90);
      TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
      if ((_Base_ptr)local_c8._0_8_ != (_Base_ptr)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
      }
      goto LAB_005c240f;
    }
    (*(*(_func_int ***)p_Var13)[0xb])(local_c8,p_Var13,(ulong)uVar4,*(undefined8 *)pEVar9);
    TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    break;
  case 9:
    local_90._0_8_ = local_90 + 0x10;
    local_90._8_8_ = 0;
    local_90[0x10] = '\0';
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x35])(reflection,message,field,index,local_90);
      this_00 = (string *)CONCAT44(extraout_var_02,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field,local_90);
      this_00 = (string *)CONCAT44(extraout_var_06,iVar3);
    }
    local_48 = (_Base_ptr)0x0;
    local_40 = 0;
    local_50 = (_Base_ptr)&local_40;
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < *(ulong *)(this_00 + 8))) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)this_00);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)local_70);
      p_Var11 = (_Base_ptr)(puVar10 + 2);
      if ((_Base_ptr)*puVar10 == p_Var11) {
        local_b8._0_8_ = *(undefined8 *)p_Var11;
        local_b8._M_parent = (_Base_ptr)puVar10[3];
        local_c8._0_8_ = (_Base_ptr)(local_c8 + 0x10);
      }
      else {
        local_b8._0_8_ = *(undefined8 *)p_Var11;
        local_c8._0_8_ = (_Base_ptr)*puVar10;
      }
      local_c8._8_8_ = puVar10[1];
      *puVar10 = p_Var11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      this_00 = (string *)&local_50;
      std::__cxx11::string::operator=(this_00,(string *)local_c8);
      if ((_Base_ptr)local_c8._0_8_ != (_Base_ptr)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
      }
      if (local_70[0] != (_Base_ptr)local_60) {
        operator_delete(local_70[0],local_60._0_8_ + 1);
      }
    }
    TVar2 = FieldDescriptor::type(field);
    if (TVar2 == TYPE_STRING) {
      (*(*(_func_int ***)p_Var13)[9])(local_c8,p_Var13,this_00);
      TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    }
    else {
      TVar2 = FieldDescriptor::type(field);
      if (TVar2 != TYPE_BYTES) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x6f9);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_c8,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=((LogFinisher *)local_70,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_c8);
      }
      (*(*(_func_int ***)p_Var13)[10])(local_c8,p_Var13,this_00);
      TextGenerator::Print(generator,(char *)local_c8._0_8_,local_c8._8_8_);
    }
    if ((_Base_ptr)local_c8._0_8_ != (_Base_ptr)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
    }
    if (local_50 != (_Base_ptr)&local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
LAB_005c240f:
    if ((_Base_ptr)local_90._0_8_ == (_Base_ptr)(local_90 + 0x10)) {
      return;
    }
    pp_Var12 = (_func_int **)CONCAT71(local_90._17_7_,local_90[0x10]);
    p_Var13 = (_Base_ptr)local_90._0_8_;
    goto LAB_005c21ad;
  case 10:
    if (*(int *)(field + 0x4c) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x34])();
      message_00 = (Message *)CONCAT44(extraout_var,iVar3);
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field,0);
      message_00 = (Message *)CONCAT44(extraout_var_03,iVar3);
    }
    Print(this,message_00,generator);
  default:
    goto switchD_005c1e64_default;
  }
  pp_Var12 = (_func_int **)local_b8._0_8_;
  p_Var13 = (_Base_ptr)local_c8._0_8_;
  if ((_Base_ptr)local_c8._0_8_ != (_Base_ptr)(local_c8 + 0x10)) {
LAB_005c21ad:
    operator_delete(p_Var13,(long)pp_Var12 + 1);
  }
switchD_005c1e64_default:
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(
    const Message& message,
    const Reflection* reflection,
    const FieldDescriptor* field,
    int index,
    TextGenerator& generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FieldValuePrinter* printer
      = FindWithDefault(custom_printers_, field,
                        default_field_value_printer_.get());

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                   \
    case FieldDescriptor::CPPTYPE_##CPPTYPE:                            \
      generator.Print(printer->Print##METHOD(field->is_repeated()       \
               ? reflection->GetRepeated##METHOD(message, field, index) \
               : reflection->Get##METHOD(message, field)));             \
        break

    OUTPUT_FIELD( INT32,  Int32);
    OUTPUT_FIELD( INT64,  Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD( FLOAT,  Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(  BOOL,   Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      string scratch;
      const string& value = field->is_repeated()
          ? reflection->GetRepeatedStringReference(
              message, field, index, &scratch)
          : reflection->GetStringReference(message, field, &scratch);
      const string* value_to_print = &value;
      string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        generator.Print(printer->PrintString(*value_to_print));
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        generator.Print(printer->PrintBytes(*value_to_print));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value = field->is_repeated()
          ? reflection->GetRepeatedEnumValue(message, field, index)
          : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != NULL) {
        generator.Print(printer->PrintEnum(enum_value, enum_desc->name()));
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        generator.Print(printer->PrintEnum(enum_value,
                                           StringPrintf("%d", enum_value)));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
            ? reflection->GetRepeatedMessage(message, field, index)
            : reflection->GetMessage(message, field),
            generator);
      break;
  }
}